

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O1

void ncnn::transpose_pack_A_tile_int8_avx2(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined8 *puVar15;
  long lVar16;
  undefined1 *puVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  iVar2 = cpu_support_x86_avx_vnni_int8();
  if (iVar2 != 0) {
    transpose_pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar2 = cpu_support_x86_avx_vnni();
  if (iVar2 == 0) {
    iVar2 = A->w;
    lVar3 = (long)iVar2;
    pauVar4 = (undefined1 (*) [16])AT->data;
    uVar13 = 0;
    if (7 < max_ii) {
      lVar8 = (long)i;
      lVar9 = lVar3 + lVar8;
      lVar11 = lVar8;
      uVar19 = 0;
      do {
        pvVar1 = A->data;
        lVar21 = (long)A->w * (long)k * A->elemsize;
        if (max_kk < 2) {
          lVar18 = (long)pvVar1 + lVar8 + uVar19;
          uVar20 = 0;
        }
        else {
          lVar18 = (long)pvVar1 + lVar11;
          lVar14 = (long)pvVar1 + lVar9;
          iVar6 = 1;
          do {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = *(ulong *)(lVar18 + lVar21);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = *(ulong *)(lVar14 + lVar21);
            auVar24 = vpunpcklbw_avx(auVar24,auVar25);
            *pauVar4 = auVar24;
            pauVar4 = pauVar4 + 1;
            lVar18 = lVar18 + iVar2 * 2;
            lVar14 = lVar14 + iVar2 * 2;
            iVar6 = iVar6 + 2;
            uVar20 = max_kk & 0xfffffffe;
          } while (iVar6 < max_kk);
        }
        puVar15 = (undefined8 *)(lVar18 + lVar21);
        iVar6 = max_kk - uVar20;
        if (iVar6 != 0 && (int)uVar20 <= max_kk) {
          do {
            *(undefined8 *)*pauVar4 = *puVar15;
            pauVar4 = (undefined1 (*) [16])(*pauVar4 + 8);
            puVar15 = (undefined8 *)((long)puVar15 + lVar3);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar13 = uVar19 + 8;
        uVar23 = uVar19 + 0xf;
        lVar11 = lVar11 + 8;
        lVar9 = lVar9 + 8;
        uVar19 = uVar13;
      } while (uVar23 < (uint)max_ii);
    }
    if ((int)((uint)uVar13 | 3) < max_ii) {
      lVar21 = (long)(iVar2 * 2);
      lVar9 = (long)i + (uVar13 & 0xffffffff);
      lVar18 = (iVar2 + 3) + lVar9;
      lVar14 = (iVar2 + 2) + lVar9;
      lVar8 = (iVar2 + 1) + lVar9;
      lVar11 = lVar9 + lVar3;
      uVar19 = uVar13 & 0xffffffff;
      do {
        pvVar1 = A->data;
        lVar10 = (long)A->w * (long)k * A->elemsize;
        if (max_kk < 2) {
          lVar5 = (long)pvVar1 + (long)i + uVar19;
          uVar20 = 0;
        }
        else {
          lVar5 = (long)pvVar1 + lVar9;
          lVar12 = lVar18 + (long)pvVar1;
          lVar22 = lVar14 + (long)pvVar1;
          lVar7 = (long)pvVar1 + lVar8;
          lVar16 = (long)pvVar1 + lVar11;
          iVar6 = 1;
          do {
            (*pauVar4)[0] = *(undefined1 *)(lVar5 + lVar10);
            (*pauVar4)[1] = *(undefined1 *)(lVar16 + lVar10);
            (*pauVar4)[2] = *(undefined1 *)(lVar5 + 1 + lVar10);
            (*pauVar4)[3] = *(undefined1 *)(lVar7 + lVar10);
            (*pauVar4)[4] = *(undefined1 *)(lVar5 + 2 + lVar10);
            (*pauVar4)[5] = *(undefined1 *)(lVar22 + lVar10);
            (*pauVar4)[6] = *(undefined1 *)(lVar5 + 3 + lVar10);
            (*pauVar4)[7] = *(undefined1 *)(lVar12 + lVar10);
            pauVar4 = (undefined1 (*) [16])(*pauVar4 + 8);
            iVar6 = iVar6 + 2;
            lVar5 = lVar5 + lVar21;
            lVar12 = lVar12 + lVar21;
            lVar22 = lVar22 + lVar21;
            lVar7 = lVar7 + lVar21;
            lVar16 = lVar16 + lVar21;
            uVar20 = max_kk & 0xfffffffe;
          } while (iVar6 < max_kk);
        }
        iVar6 = max_kk - uVar20;
        if (iVar6 != 0 && (int)uVar20 <= max_kk) {
          puVar17 = (undefined1 *)(lVar5 + lVar10 + 3);
          do {
            (*pauVar4)[0] = puVar17[-3];
            (*pauVar4)[1] = puVar17[-2];
            (*pauVar4)[2] = puVar17[-1];
            (*pauVar4)[3] = *puVar17;
            pauVar4 = (undefined1 (*) [16])(*pauVar4 + 4);
            puVar17 = puVar17 + lVar3;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        uVar13 = uVar19 + 4;
        lVar10 = uVar19 + 7;
        lVar9 = lVar9 + 4;
        lVar18 = lVar18 + 4;
        lVar14 = lVar14 + 4;
        lVar8 = lVar8 + 4;
        lVar11 = lVar11 + 4;
        uVar19 = uVar13;
      } while (lVar10 < max_ii);
    }
    if ((int)((uint)uVar13 | 1) < max_ii) {
      lVar21 = (long)(iVar2 * 2);
      lVar9 = (long)i + (uVar13 & 0xffffffff);
      lVar8 = (iVar2 + 1) + lVar9;
      lVar11 = lVar9 + lVar3;
      uVar19 = uVar13 & 0xffffffff;
      do {
        pvVar1 = A->data;
        lVar18 = (long)A->w * (long)k * A->elemsize;
        if (max_kk < 2) {
          lVar14 = (long)pvVar1 + (long)i + uVar19;
          uVar20 = 0;
        }
        else {
          lVar14 = (long)pvVar1 + lVar9;
          lVar10 = (long)pvVar1 + lVar8;
          lVar5 = (long)pvVar1 + lVar11;
          iVar2 = 1;
          do {
            (*pauVar4)[0] = *(undefined1 *)(lVar14 + lVar18);
            (*pauVar4)[1] = *(undefined1 *)(lVar5 + lVar18);
            (*pauVar4)[2] = *(undefined1 *)(lVar14 + 1 + lVar18);
            (*pauVar4)[3] = *(undefined1 *)(lVar10 + lVar18);
            pauVar4 = (undefined1 (*) [16])(*pauVar4 + 4);
            iVar2 = iVar2 + 2;
            lVar14 = lVar14 + lVar21;
            lVar10 = lVar10 + lVar21;
            lVar5 = lVar5 + lVar21;
            uVar20 = max_kk & 0xfffffffe;
          } while (iVar2 < max_kk);
        }
        iVar2 = max_kk - uVar20;
        if (iVar2 != 0 && (int)uVar20 <= max_kk) {
          puVar17 = (undefined1 *)(lVar14 + lVar18 + 1);
          do {
            (*pauVar4)[0] = puVar17[-1];
            (*pauVar4)[1] = *puVar17;
            pauVar4 = (undefined1 (*) [16])(*pauVar4 + 2);
            puVar17 = puVar17 + lVar3;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        uVar13 = uVar19 + 2;
        lVar18 = uVar19 + 3;
        lVar9 = lVar9 + 2;
        lVar8 = lVar8 + 2;
        lVar11 = lVar11 + 2;
        uVar19 = uVar13;
      } while (lVar18 < max_ii);
    }
    if ((int)uVar13 < max_ii) {
      lVar9 = (long)(int)uVar13;
      do {
        if (0 < max_kk) {
          puVar17 = (undefined1 *)
                    ((long)A->data + (long)i + lVar9 + (long)A->w * (long)k * A->elemsize);
          iVar2 = max_kk;
          do {
            (*pauVar4)[0] = *puVar17;
            pauVar4 = (undefined1 (*) [16])(*pauVar4 + 1);
            puVar17 = puVar17 + lVar3;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != max_ii);
    }
    return;
  }
  transpose_pack_A_tile_int8_avxvnni(A,AT,i,max_ii,k,max_kk);
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avx2(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}